

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void * __thiscall asmjit::Zone::_alloc(Zone *this,size_t size,size_t alignment)

{
  Block *pBVar1;
  Block *pBVar2;
  void *pvVar3;
  Block *pBVar4;
  void *extraout_RAX;
  Zone *pZVar5;
  ulong uVar6;
  Zone *__size;
  ulong uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  long lVar10;
  
  uVar7 = 1L << (byte)((this->field_3)._packedData >> 0x3d);
  pBVar1 = this->_block;
  pBVar2 = pBVar1->next;
  uVar6 = uVar7;
  if (uVar7 < alignment) {
    uVar6 = alignment;
  }
  if (pBVar2 != (Block *)0x0) {
    pvVar3 = (void *)(-uVar6 & (long)&pBVar2->size + uVar6 + 7);
    pZVar5 = (Zone *)(-uVar7 & (long)&pBVar2[1].prev + pBVar2->size);
    __size = this;
    if (size <= (ulong)((long)pZVar5 - (long)pvVar3)) goto LAB_00122df3;
  }
  lVar10 = alignment - 8;
  if (alignment < 8) {
    lVar10 = 0;
  }
  uVar9 = (this->field_3)._packedData & 0xfffffffffffffff;
  if (uVar9 <= size) {
    uVar9 = size;
  }
  if (-lVar10 - 0x19U < uVar9) {
    return (void *)0x0;
  }
  __size = (Zone *)(lVar10 + uVar9 + 0x18);
  pBVar4 = (Block *)malloc((size_t)__size);
  if (pBVar4 == (Block *)0x0) {
    return (void *)0x0;
  }
  pBVar4->prev = (Block *)0x0;
  pBVar4->next = (Block *)0x0;
  pBVar4->size = uVar9 + lVar10;
  if (pBVar1 != (Block *)_zeroBlock) {
    pBVar4->prev = pBVar1;
    pBVar1->next = pBVar4;
    if (pBVar2 != (Block *)0x0) {
      pBVar4->next = pBVar2;
      pBVar2->prev = pBVar4;
    }
  }
  pvVar3 = (void *)(-uVar6 & (long)&pBVar4->size + uVar6 + 7);
  puVar8 = (uint8_t *)(-uVar7 & (long)&pBVar4[1].prev + uVar9 + lVar10);
  size = size + (long)pvVar3;
  this->_ptr = (uint8_t *)size;
  this->_end = puVar8;
  this->_block = pBVar4;
  if (size <= puVar8) {
    return pvVar3;
  }
  _alloc();
  pvVar3 = extraout_RAX;
  pZVar5 = this;
LAB_00122df3:
  __size->_block = pBVar2;
  __size->_ptr = (uint8_t *)(size + (long)pvVar3);
  __size->_end = (uint8_t *)pZVar5;
  return pvVar3;
}

Assistant:

void* Zone::_alloc(size_t size, size_t alignment) noexcept {
  Block* curBlock = _block;
  Block* next = curBlock->next;

  size_t rawBlockAlignment = blockAlignment();
  size_t minimumAlignment = Support::max<size_t>(alignment, rawBlockAlignment);

  // If the `Zone` has been cleared the current block doesn't have to be the
  // last one. Check if there is a block that can be used instead of allocating
  // a new one. If there is a `next` block it's completely unused, we don't have
  // to check for remaining bytes in that case.
  if (next) {
    uint8_t* ptr = Support::alignUp(next->data(), minimumAlignment);
    uint8_t* end = Support::alignDown(next->data() + next->size, rawBlockAlignment);

    if (size <= (size_t)(end - ptr)) {
      _block = next;
      _ptr = ptr + size;
      _end = Support::alignDown(next->data() + next->size, rawBlockAlignment);
      return static_cast<void*>(ptr);
    }
  }

  size_t blockAlignmentOverhead = alignment - Support::min<size_t>(alignment, Globals::kAllocAlignment);
  size_t newSize = Support::max(blockSize(), size);

  // Prevent arithmetic overflow.
  if (ASMJIT_UNLIKELY(newSize > SIZE_MAX - kBlockSize - blockAlignmentOverhead))
    return nullptr;

  // Allocate new block - we add alignment overhead to `newSize`, which becomes the
  // new block size, and we also add `kBlockOverhead` to the allocator as it includes
  // members of `Zone::Block` structure.
  newSize += blockAlignmentOverhead;
  Block* newBlock = static_cast<Block*>(::malloc(newSize + kBlockSize));

  if (ASMJIT_UNLIKELY(!newBlock))
    return nullptr;

  // Align the pointer to `minimumAlignment` and adjust the size of this block
  // accordingly. It's the same as using `minimumAlignment - Support::alignUpDiff()`,
  // just written differently.
  {
    newBlock->prev = nullptr;
    newBlock->next = nullptr;
    newBlock->size = newSize;

    if (curBlock != &_zeroBlock) {
      newBlock->prev = curBlock;
      curBlock->next = newBlock;

      // Does only happen if there is a next block, but the requested memory
      // can't fit into it. In this case a new buffer is allocated and inserted
      // between the current block and the next one.
      if (next) {
        newBlock->next = next;
        next->prev = newBlock;
      }
    }

    uint8_t* ptr = Support::alignUp(newBlock->data(), minimumAlignment);
    uint8_t* end = Support::alignDown(newBlock->data() + newSize, rawBlockAlignment);

    _ptr = ptr + size;
    _end = end;
    _block = newBlock;

    ASMJIT_ASSERT(_ptr <= _end);
    return static_cast<void*>(ptr);
  }
}